

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-inl.h
# Opt level: O0

Index __thiscall
wabt::interp::FreeList<wabt::interp::Object*>::New<wabt::interp::Memory*>
          (FreeList<wabt::interp::Object*> *this,Memory **args)

{
  Memory *pMVar1;
  bool bVar2;
  size_type sVar3;
  FreeList<wabt::interp::Object_*> *index_00;
  reference ppOVar4;
  Index index;
  Memory **local_20;
  Memory **args_local;
  FreeList<wabt::interp::Object_*> *this_local;
  
  local_20 = args;
  args_local = (Memory **)this;
  if (*(long *)(this + 0x18) == 0) {
    index = (Index)*args;
    std::vector<wabt::interp::Object_*,_std::allocator<wabt::interp::Object_*>_>::push_back
              ((vector<wabt::interp::Object_*,_std::allocator<wabt::interp::Object_*>_> *)this,
               (value_type *)&index);
    sVar3 = std::vector<wabt::interp::Object_*,_std::allocator<wabt::interp::Object_*>_>::size
                      ((vector<wabt::interp::Object_*,_std::allocator<wabt::interp::Object_*>_> *)
                       this);
    this_local = (FreeList<wabt::interp::Object_*> *)(sVar3 - 1);
  }
  else {
    index_00 = (FreeList<wabt::interp::Object_*> *)(*(long *)(this + 0x18) - 1);
    bVar2 = FreeList<wabt::interp::Object_*>::IsUsed
                      ((FreeList<wabt::interp::Object_*> *)this,(Index)index_00);
    if (((bVar2 ^ 0xffU) & 1) == 0) {
      __assert_fail("!IsUsed(index)",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/include/wabt/interp/interp-inl.h"
                    ,0xcb,
                    "Index wabt::interp::FreeList<wabt::interp::Object *>::New(Args &&...) [T = wabt::interp::Object *, Args = <wabt::interp::Memory *>]"
                   );
    }
    if (*(long *)(this + 0x20) == 0) {
      __assert_fail("free_items_ > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/include/wabt/interp/interp-inl.h"
                    ,0xcc,
                    "Index wabt::interp::FreeList<wabt::interp::Object *>::New(Args &&...) [T = wabt::interp::Object *, Args = <wabt::interp::Memory *>]"
                   );
    }
    ppOVar4 = std::vector<wabt::interp::Object_*,_std::allocator<wabt::interp::Object_*>_>::
              operator[]((vector<wabt::interp::Object_*,_std::allocator<wabt::interp::Object_*>_> *)
                         this,(size_type)index_00);
    *(ulong *)(this + 0x18) = (ulong)*ppOVar4 >> 1;
    pMVar1 = *local_20;
    ppOVar4 = std::vector<wabt::interp::Object_*,_std::allocator<wabt::interp::Object_*>_>::
              operator[]((vector<wabt::interp::Object_*,_std::allocator<wabt::interp::Object_*>_> *)
                         this,(size_type)index_00);
    *ppOVar4 = (value_type)pMVar1;
    *(long *)(this + 0x20) = *(long *)(this + 0x20) + -1;
    this_local = index_00;
  }
  return (Index)this_local;
}

Assistant:

auto FreeList<T>::New(Args&&... args) -> Index {
  if (free_head_ == 0) {
    list_.push_back(T(std::forward<Args>(args)...));
    return list_.size() - 1;
  }

  Index index = free_head_ - 1;

  assert(!IsUsed(index));
  assert(free_items_ > 0);

  free_head_ = reinterpret_cast<uintptr_t>(list_[index]) >> ptrFreeShift;
  list_[index] = T(std::forward<Args>(args)...);
  free_items_--;
  return index;
}